

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_StartLightFading(int tag,int value,int tics)

{
  sector_t_conflict *sector;
  short sVar1;
  DSectorEffect *pDVar2;
  uint uVar3;
  DLighting *this;
  int iVar4;
  int iVar5;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_38.searchtag = tag;
  uVar3 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar3) {
    iVar4 = 0x7fff;
    if (value < 0x7fff) {
      iVar4 = value;
    }
    iVar5 = -0x8000;
    if (-0x8000 < iVar4) {
      iVar5 = iVar4;
    }
    do {
      sector = sectors + uVar3;
      pDVar2 = sectors[uVar3].lightingdata.field_0.p;
      if (pDVar2 == (DSectorEffect *)0x0) {
LAB_004026d6:
        if (tics < 1) {
          sector->lightlevel = (short)iVar5;
        }
        else if (sector->lightlevel != value) {
          this = (DLighting *)
                 M_Malloc_Dbg(0x58,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                              ,0x1f9);
          sVar1 = sector->lightlevel;
          DLighting::DLighting(this,(sector_t *)sector);
          (this->super_DSectorEffect).super_DThinker.super_DObject._vptr_DObject =
               (_func_int **)&PTR_StaticType_006f9378;
          *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
               (int)sVar1;
          *(int *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject + 4
                  ) = iVar5;
          *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class = tics;
          *(undefined4 *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class + 4)
               = 0xffffffff;
          *(undefined1 *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.ObjNext = 1;
        }
      }
      else if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
        goto LAB_004026d6;
      }
      uVar3 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar3);
  }
  return;
}

Assistant:

void EV_StartLightFading (int tag, int value, int tics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;

		if (tics <= 0)
		{
			sec->SetLightLevel(value);
		}
		else
		{
			// No need to fade if lightlevel is already at desired value.
			if (sec->lightlevel == value)
				continue;

			new DGlow2 (sec, sec->lightlevel, value, tics, true);
		}
	}
}